

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O0

err_t cmdFileDup(char *oname,char *iname,size_t skip,size_t count)

{
  bool_t bVar1;
  file_t pFVar2;
  blob_t pvVar3;
  size_t *psVar4;
  size_t *in_RCX;
  size_t c;
  void *buf;
  file_t ofile;
  file_t ifile;
  err_t code;
  size_t buf_size;
  char *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar5;
  file_t in_stack_ffffffffffffff98;
  size_t *file;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  void *in_stack_ffffffffffffffa8;
  size_t *psVar6;
  err_t local_34;
  size_t *local_28;
  err_t local_4;
  
  pFVar2 = fileOpen((char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
  local_4 = 0xcb;
  if (pFVar2 != (file_t)0x0) {
    local_4 = 0;
  }
  if (local_4 == 0) {
    bVar1 = fileSeek((file_t)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     (size_t)in_stack_ffffffffffffff88,0);
    if (bVar1 == 0) {
      fileClose((file_t)0x105910);
      local_4 = 0xcf;
    }
    else {
      pFVar2 = fileOpen((char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
      local_4 = 0xcb;
      if (pFVar2 != (file_t)0x0) {
        local_4 = 0;
      }
      if (local_4 == 0) {
        pvVar3 = blobCreate((size_t)in_stack_ffffffffffffff88);
        local_34 = 0x6e;
        if (pvVar3 != (blob_t)0x0) {
          local_34 = 0;
        }
        if (local_34 == 0) {
          local_28 = in_RCX;
          if (in_RCX == (size_t *)0xffffffffffffffff) {
            local_28 = (size_t *)0xffffffffffffffff;
            while (uVar5 = local_28 != (size_t *)0x0 && local_34 == 0,
                  local_28 != (size_t *)0x0 && local_34 == 0) {
              local_28 = (size_t *)
                         fileRead2(in_stack_ffffffffffffffa8,
                                   CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                                   in_stack_ffffffffffffff98);
              if (local_28 == (size_t *)0xffffffffffffffff) {
                local_34 = 0xcf;
              }
              else {
                local_34 = fileWrite((size_t *)in_stack_ffffffffffffff98,
                                     (void *)CONCAT17(uVar5,in_stack_ffffffffffffff90),
                                     (size_t)in_stack_ffffffffffffff88,(file_t)0x105ad8);
              }
            }
          }
          else {
            for (; local_28 != (size_t *)0x0 && local_34 == 0;
                local_28 = (size_t *)((long)local_28 - (long)psVar6)) {
              file = local_28;
              if (&DAT_00001000 < local_28) {
                file = (size_t *)&DAT_00001000;
              }
              psVar6 = file;
              psVar4 = (size_t *)
                       fileRead2(file,CONCAT17(local_28 != (size_t *)0x0 && local_34 == 0,
                                               in_stack_ffffffffffffffa0),(file_t)file);
              if (psVar4 == psVar6) {
                local_34 = fileWrite(file,(void *)CONCAT17(in_stack_ffffffffffffff97,
                                                           in_stack_ffffffffffffff90),
                                     (size_t)in_stack_ffffffffffffff88,(file_t)0x105a51);
              }
              else {
                local_34 = 0xcf;
              }
            }
          }
          blobClose((blob_t)0x105aea);
          if (local_34 == 0) {
            bVar1 = fileClose((file_t)0x105b19);
            local_4 = 0x67;
            if (bVar1 != 0) {
              local_4 = 0;
            }
            if (local_4 == 0) {
              bVar1 = fileClose((file_t)0x105b51);
              local_4 = 0x67;
              if (bVar1 != 0) {
                local_4 = 0;
              }
            }
            else {
              fileClose((file_t)0x105b3d);
            }
          }
          else {
            fileClose((file_t)0x105afb);
            fileClose((file_t)0x105b05);
            local_4 = local_34;
          }
        }
        else {
          fileClose((file_t)0x10599b);
          fileClose((file_t)0x1059a5);
          local_4 = local_34;
        }
      }
      else {
        fileClose((file_t)0x105959);
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdFileDup(const char* oname, const char* iname, size_t skip,
	size_t count)
{
	const size_t buf_size = 4096;
	err_t code;
	file_t ifile;
	file_t ofile;
	void* buf;
	// pre
	ASSERT(strIsValid(iname) && strIsValid(oname));
	// открыть входной файл
	code = cmdFileOpen(ifile, iname, "rb");
	ERR_CALL_CHECK(code);
	// пропустить skip октетов
	if (!fileSeek(ifile, skip, SEEK_SET))
	{
		cmdFileClose(ifile);
		return ERR_FILE_READ;
	}
	// открыть выходной файл
	code = cmdFileOpen(ofile, oname, "wb");
	ERR_CALL_HANDLE(code, cmdFileClose(ifile));
	// подготовить память
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, (cmdFileClose(ofile), cmdFileClose(ifile)));
	// дублировать count октетов
	if (count != SIZE_MAX)
		while (count && code == ERR_OK)
		{
			size_t c = MIN2(buf_size, count);
			if (fileRead2(buf, c, ifile) != c)
				code = ERR_FILE_READ;
			else
				code = fileWrite(&c, buf, c, ofile);
			count -= c;
		}
	// дублировать все
	else
		while (count && code == ERR_OK)
		{
			count = fileRead2(buf, buf_size, ifile);
			if (count == SIZE_MAX)
				code = ERR_FILE_READ;
			else 
				code = fileWrite(&count, buf, count, ofile);
		}
	// завершить
	cmdBlobClose(buf);
	ERR_CALL_HANDLE(code, (cmdFileClose(ofile), cmdFileClose(ifile)));
	code = cmdFileClose(ofile);
	ERR_CALL_HANDLE(code, cmdFileClose(ifile));
	return cmdFileClose(ifile);
}